

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  undefined8 *puVar1;
  Fts5ExprTerm **ppFVar2;
  u8 uVar3;
  int iVar4;
  u32 nData;
  Fts5ExprNearset *pFVar5;
  Fts5ExprPhrase *pFVar6;
  long lVar7;
  Fts5IndexIter *pFVar8;
  u8 *puVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  Fts5ExprTerm *p;
  Fts5ExprTerm *pFVar13;
  long lVar14;
  undefined1 *__s;
  ulong uVar15;
  Fts5LookaheadReader *__s_00;
  Fts5ExprTerm *p_1;
  Fts5ExprTerm *pFVar16;
  long lVar17;
  ulong uVar18;
  i64 *piVar19;
  Fts5ExprTerm *p_2;
  long lVar20;
  uint uVar21;
  long lVar22;
  int *piVar23;
  char *pcVar24;
  long lVar25;
  Fts5LookaheadReader *pFVar26;
  long in_FS_OFFSET;
  bool bVar27;
  int rc;
  u8 *a;
  int n;
  Fts5PoslistWriter writer;
  Fts5NearTrimmer aStatic [4];
  int local_12c;
  Fts5Buffer local_128;
  u8 *local_110;
  int local_104;
  Fts5PoslistWriter local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar5 = pNode->pNear;
  pFVar6 = pFVar5->apPhrase[0];
  uVar21 = pExpr->bDesc;
  if (pFVar6->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    lVar25 = (pFVar6->aTerm[0].pIter)->iRowid;
  }
  else {
    pFVar13 = pFVar6->aTerm;
    lVar25 = 0;
    bVar27 = false;
    do {
      if ((pFVar13->pIter->bEof == '\0') &&
         ((lVar17 = pFVar13->pIter->iRowid, !bVar27 || (bVar27 = true, uVar21 != lVar17 < lVar25))))
      {
        bVar27 = true;
        lVar25 = lVar17;
      }
      pFVar13 = pFVar13->pSynonym;
    } while (pFVar13 != (Fts5ExprTerm *)0x0);
  }
  iVar11 = pFVar5->nPhrase;
  do {
    if (iVar11 < 1) break;
    bVar27 = true;
    lVar17 = 0;
    do {
      pFVar6 = pFVar5->apPhrase[lVar17];
      if (0 < pFVar6->nTerm) {
        lVar22 = 0;
        lVar20 = lVar25;
        do {
          pFVar13 = pFVar6->aTerm + lVar22;
          lVar25 = lVar20;
          if (pFVar13->pSynonym == (Fts5ExprTerm *)0x0) {
            pFVar8 = pFVar13->pIter;
            lVar14 = pFVar8->iRowid;
            if (lVar14 != lVar20) {
              bVar27 = false;
              if ((uVar21 == 0 && lVar14 < lVar20) ||
                 (lVar25 = lVar14, uVar21 != 0 && lVar20 < lVar14)) {
                iVar11 = sqlite3Fts5IterNextFrom(pFVar8,lVar20);
                if ((iVar11 != 0) || (pFVar8->bEof != '\0')) {
                  pNode->bEof = 1;
                  goto LAB_001e16f2;
                }
                lVar25 = pFVar8->iRowid;
              }
            }
          }
          else {
            lVar14 = 0;
            bVar10 = false;
            pFVar16 = pFVar13;
            do {
              if ((pFVar16->pIter->bEof == '\0') &&
                 ((lVar7 = pFVar16->pIter->iRowid, !bVar10 ||
                  (bVar10 = true, uVar21 != lVar7 < lVar14)))) {
                bVar10 = true;
                lVar14 = lVar7;
              }
              pFVar16 = pFVar16->pSynonym;
            } while (pFVar16 != (Fts5ExprTerm *)0x0);
            pFVar16 = pFVar13;
            if (lVar14 != lVar20) {
              do {
                pFVar8 = pFVar16->pIter;
                iVar11 = 0;
                if (pFVar8->bEof == '\0') {
                  if ((uVar21 == 0 && pFVar8->iRowid < lVar20) ||
                     (uVar21 != 0 && lVar20 < pFVar8->iRowid)) {
                    iVar11 = sqlite3Fts5IterNextFrom(pFVar8,lVar20);
                  }
                }
              } while ((iVar11 == 0) &&
                      (ppFVar2 = &pFVar16->pSynonym, pFVar16 = *ppFVar2,
                      *ppFVar2 != (Fts5ExprTerm *)0x0));
              if (iVar11 == 0) {
                lVar25 = 0;
                bVar10 = false;
                do {
                  if ((pFVar13->pIter->bEof == '\0') &&
                     ((lVar20 = pFVar13->pIter->iRowid, !bVar10 ||
                      (bVar10 = true, uVar21 != lVar20 < lVar25)))) {
                    bVar10 = true;
                    lVar25 = lVar20;
                  }
                  pFVar13 = pFVar13->pSynonym;
                } while (pFVar13 != (Fts5ExprTerm *)0x0);
                bVar27 = false;
                iVar11 = 0;
                if (bVar10) goto LAB_001e1631;
              }
              pNode->bEof = 1;
              pNode->bNomatch = 0;
              goto LAB_001e16f2;
            }
          }
LAB_001e1631:
          lVar22 = lVar22 + 1;
          lVar20 = lVar25;
        } while (lVar22 < pFVar6->nTerm);
        iVar11 = pFVar5->nPhrase;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar11);
  } while (!bVar27);
  pNode->iRowid = lVar25;
  pFVar5 = pNode->pNear;
  local_12c = 0;
  if (pExpr->pConfig->eDetail == 0) {
    lVar25 = 0;
    do {
      if (pFVar5->nPhrase <= lVar25) {
        iVar11 = 0;
        break;
      }
      pFVar6 = pFVar5->apPhrase[lVar25];
      uVar21 = pFVar6->nTerm;
      if ((long)(int)uVar21 < 2) {
        if (((pFVar6->aTerm[0].pSynonym != (Fts5ExprTerm *)0x0) ||
            (pFVar5->pColset != (Fts5Colset *)0x0)) || (pFVar6->aTerm[0].bFirst != '\0')) {
          uVar3 = pFVar6->aTerm[0].bFirst;
          (pFVar6->poslist).n = 0;
          goto LAB_001e17c7;
        }
        pFVar8 = pFVar6->aTerm[0].pIter;
        nData = pFVar8->nData;
        puVar9 = pFVar8->pData;
        (pFVar6->poslist).n = 0;
        sqlite3Fts5BufferAppendBlob(&local_12c,&pFVar6->poslist,nData,puVar9);
      }
      else {
        local_100.iPrev = 0;
        uVar3 = pFVar6->aTerm[0].bFirst;
        (pFVar6->poslist).n = 0;
        if (uVar21 < 5) {
LAB_001e17c7:
          local_100.iPrev = 0;
          __s = local_f8;
        }
        else {
          iVar11 = sqlite3_initialize();
          if ((iVar11 != 0) ||
             (__s = (undefined1 *)sqlite3Malloc((long)(int)uVar21 << 5), __s == (undefined1 *)0x0))
          {
            local_12c = 7;
            iVar11 = 7;
            break;
          }
          uVar21 = pFVar6->nTerm;
        }
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        memset(__s,0,(long)(int)uVar21 << 5);
        uVar15 = (ulong)(uint)pFVar6->nTerm;
        if (pFVar6->nTerm < 1) {
LAB_001e1909:
          do {
            uVar18 = *(ulong *)(__s + 0x18);
            do {
              if ((int)uVar15 < 1) break;
              bVar27 = true;
              lVar17 = 0;
              do {
                lVar20 = uVar18 + lVar17;
                if (*(long *)(__s + (lVar17 * 4 + 3) * 8) != lVar20) {
                  puVar1 = (undefined8 *)(__s + lVar17 * 0x20);
LAB_001e1957:
                  lVar22 = *(long *)(__s + (lVar17 * 4 + 3) * 8);
                  if (lVar22 < lVar20) {
                    iVar11 = sqlite3Fts5PoslistNext64
                                       ((u8 *)*puVar1,*(int *)(puVar1 + 1),
                                        (int *)((long)puVar1 + 0xc),
                                        (i64 *)(__s + (lVar17 * 4 + 3) * 8));
                    if (iVar11 == 0) goto code_r0x001e1979;
                    *(undefined1 *)((long)puVar1 + 0x11) = 1;
                    goto LAB_001e1a36;
                  }
                  if (lVar20 < lVar22) {
                    uVar18 = lVar22 - lVar17;
                  }
                  uVar15 = (ulong)(uint)pFVar6->nTerm;
                  bVar27 = false;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar15);
            } while (!bVar27);
            if ((uVar3 == '\0') || ((uVar18 & 0x7fffffff) == 0)) {
              iVar11 = sqlite3Fts5PoslistWriterAppend(&pFVar6->poslist,&local_100,uVar18);
              if (iVar11 != 0) goto LAB_001e1a53;
              uVar15 = (ulong)(uint)pFVar6->nTerm;
            }
            if (0 < (int)uVar15) {
              lVar17 = 0;
              piVar23 = (int *)(__s + 0xc);
              do {
                iVar11 = sqlite3Fts5PoslistNext64
                                   (*(u8 **)(piVar23 + -3),piVar23[-1],piVar23,(i64 *)(piVar23 + 3))
                ;
                if (iVar11 != 0) {
                  *(undefined1 *)((long)piVar23 + 5) = 1;
                  goto LAB_001e1a48;
                }
                if (*(char *)((long)piVar23 + 5) != '\0') goto LAB_001e1a48;
                lVar17 = lVar17 + 1;
                uVar15 = (ulong)pFVar6->nTerm;
                piVar23 = piVar23 + 8;
              } while (lVar17 < (long)uVar15);
            }
          } while( true );
        }
        pFVar13 = pFVar6->aTerm;
        piVar23 = (int *)(__s + 0xc);
        lVar17 = 0;
        while( true ) {
          local_104 = 0;
          local_110 = (u8 *)0x0;
          if (pFVar13->pSynonym == (Fts5ExprTerm *)0x0) {
            local_110 = pFVar13->pIter->pData;
            local_104 = pFVar13->pIter->nData;
            bVar27 = false;
          }
          else {
            local_128.p = (u8 *)0x0;
            local_128.n = 0;
            local_128.nSpace = 0;
            iVar11 = fts5ExprSynonymList(pFVar13,pNode->iRowid,&local_128,&local_110,&local_104);
            if (iVar11 != 0) {
              sqlite3_free(local_110);
              goto LAB_001e1a53;
            }
            bVar27 = local_110 == local_128.p;
          }
          piVar23[-3] = 0;
          piVar23[-2] = 0;
          piVar23[-1] = 0;
          piVar23[0] = 0;
          piVar23[1] = 0;
          piVar23[2] = 0;
          piVar23[3] = 0;
          piVar23[4] = 0;
          *(u8 **)(piVar23 + -3) = local_110;
          piVar23[-1] = local_104;
          iVar11 = sqlite3Fts5PoslistNext64(local_110,local_104,piVar23,(i64 *)(piVar23 + 3));
          if (iVar11 != 0) break;
          *(bool *)(piVar23 + 1) = bVar27;
          if (*(char *)((long)piVar23 + 5) != '\0') goto LAB_001e1a48;
          lVar17 = lVar17 + 1;
          uVar15 = (ulong)pFVar6->nTerm;
          piVar23 = piVar23 + 8;
          pFVar13 = pFVar13 + 1;
          if ((long)uVar15 <= lVar17) goto LAB_001e1909;
        }
        *(undefined1 *)((long)piVar23 + 5) = 1;
        *(bool *)(piVar23 + 1) = bVar27;
LAB_001e1a48:
        iVar11 = 0;
LAB_001e1a53:
        iVar4 = (pFVar6->poslist).n;
        iVar12 = pFVar6->nTerm;
        if (0 < iVar12) {
          pcVar24 = __s + 0x10;
          lVar17 = 0;
          do {
            if (*pcVar24 != '\0') {
              sqlite3_free(*(void **)(pcVar24 + -0x10));
              iVar12 = pFVar6->nTerm;
            }
            lVar17 = lVar17 + 1;
            pcVar24 = pcVar24 + 0x20;
          } while (lVar17 < iVar12);
        }
        if (__s != local_f8) {
          sqlite3_free(__s);
        }
        local_12c = iVar11;
        if (iVar4 < 1) break;
      }
      lVar25 = lVar25 + 1;
      iVar11 = local_12c;
    } while (local_12c == 0);
    bVar27 = false;
    uVar21 = (uint)lVar25;
    if (pFVar5->nPhrase == uVar21) {
      if (uVar21 == 1) {
        bVar27 = true;
      }
      else {
        __s_00 = (Fts5LookaheadReader *)local_f8;
        memset(__s_00,0xaa,0xc0);
        local_128.p = (u8 *)CONCAT44(local_128.p._4_4_,iVar11);
        if ((int)uVar21 < 5) {
          memset(__s_00,0,0xc0);
        }
        else {
          __s_00 = (Fts5LookaheadReader *)
                   sqlite3Fts5MallocZero((int *)&local_128,(ulong)(uVar21 & 0x7fffffff) * 0x30);
          iVar11 = (int)local_128.p;
        }
        if (iVar11 == 0) {
          if (0 < pFVar5->nPhrase) {
            lVar25 = 0;
            pFVar26 = __s_00;
            do {
              pFVar6 = pFVar5->apPhrase[lVar25];
              puVar9 = (pFVar6->poslist).p;
              iVar11 = (pFVar6->poslist).n;
              pFVar26->a = (u8 *)0x0;
              pFVar26->n = 0;
              pFVar26->i = 0;
              pFVar26->iPos = 0;
              pFVar26->iLookahead = 0;
              pFVar26->a = puVar9;
              pFVar26->n = iVar11;
              fts5LookaheadReaderNext(pFVar26);
              fts5LookaheadReaderNext(pFVar26);
              (pFVar6->poslist).n = 0;
              *(Fts5Buffer **)&pFVar26[1].n = &pFVar6->poslist;
              lVar25 = lVar25 + 1;
              pFVar26 = (Fts5LookaheadReader *)&pFVar26[1].iPos;
            } while (lVar25 < pFVar5->nPhrase);
          }
          do {
            lVar25 = __s_00->iPos;
            uVar21 = pFVar5->nPhrase;
            do {
              if ((int)uVar21 < 1) goto LAB_001e1d0f;
              bVar27 = true;
              lVar17 = 0;
              do {
                lVar22 = lVar25 - ((long)pFVar5->nNear + (long)pFVar5->apPhrase[lVar17]->nTerm);
                lVar20 = *(long *)((long)__s_00 + lVar17 * 0x30 + 0x10);
                if ((lVar25 < lVar20) || (lVar20 < lVar22)) {
                  pFVar26 = (Fts5LookaheadReader *)(lVar17 * 0x30 + (long)__s_00);
                  while (lVar20 = pFVar26->iPos, lVar20 < lVar22) {
                    iVar11 = fts5LookaheadReaderNext(pFVar26);
                    if (iVar11 != 0) goto LAB_001e1d29;
                  }
                  if (lVar25 < lVar20) {
                    lVar25 = lVar20;
                  }
                  uVar21 = pFVar5->nPhrase;
                  bVar27 = false;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < (int)uVar21);
            } while (!bVar27);
            if ((int)uVar21 < 1) {
LAB_001e1d0f:
              lVar25 = 0;
            }
            else {
              lVar25 = 0;
              pFVar26 = __s_00 + 1;
              do {
                if (((*(Fts5Buffer **)&pFVar26->n)->n == 0) ||
                   ((u8 *)pFVar26[-1].iPos != pFVar26->a)) {
                  sqlite3Fts5PoslistWriterAppend
                            (*(Fts5Buffer **)&pFVar26->n,(Fts5PoslistWriter *)pFVar26,
                             pFVar26[-1].iPos);
                  uVar21 = pFVar5->nPhrase;
                }
                lVar25 = lVar25 + 1;
                pFVar26 = (Fts5LookaheadReader *)&pFVar26[1].iPos;
              } while (lVar25 < (int)uVar21);
              if ((int)uVar21 < 1) goto LAB_001e1d0f;
              lVar25 = __s_00->iLookahead;
              uVar18 = 0;
              uVar15 = 0;
              piVar19 = &__s_00->iLookahead;
              do {
                if (*piVar19 < lVar25) {
                  uVar15 = uVar18 & 0xffffffff;
                  lVar25 = *piVar19;
                }
                uVar18 = uVar18 + 1;
                piVar19 = piVar19 + 6;
              } while (uVar21 != uVar18);
              lVar25 = (long)(int)uVar15;
            }
            iVar11 = fts5LookaheadReaderNext((Fts5LookaheadReader *)(lVar25 * 0x30 + (long)__s_00));
          } while (iVar11 == 0);
LAB_001e1d29:
          iVar4 = *(int *)(*(long *)&__s_00[1].n + 8);
          iVar11 = (int)local_128.p;
          if (__s_00 != (Fts5LookaheadReader *)local_f8) {
            sqlite3_free(__s_00);
          }
          bVar27 = 0 < iVar4;
        }
      }
    }
  }
  else {
    pFVar6 = pFVar5->apPhrase[0];
    (pFVar6->poslist).n = 0;
    pFVar13 = pFVar6->aTerm;
    bVar27 = false;
    do {
      pFVar8 = pFVar13->pIter;
      if (((pFVar8->bEof == '\0') && (pFVar8->iRowid == lVar25)) && (0 < pFVar8->nData)) {
        (pFVar6->poslist).n = 1;
        bVar27 = true;
      }
      pFVar13 = pFVar13->pSynonym;
    } while (pFVar13 != (Fts5ExprTerm *)0x0);
    iVar11 = 0;
  }
  pNode->bNomatch = (uint)(!bVar27 && iVar11 == 0);
LAB_001e16f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar11;
  }
  __stack_chk_fail();
code_r0x001e1979:
  if (*(char *)((long)puVar1 + 0x11) != '\0') {
LAB_001e1a36:
    iVar11 = 0;
    goto LAB_001e1a53;
  }
  goto LAB_001e1957;
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1
       || pNear->apPhrase[0]->nTerm>1
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}